

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_write_certificate_verify(mbedtls_ssl_context *ssl)

{
  uchar uVar1;
  int iVar2;
  mbedtls_x509_crt *pmVar3;
  mbedtls_pk_context *pmVar4;
  uint local_78;
  mbedtls_md_type_t local_74;
  uint hashlen;
  mbedtls_md_type_t md_alg;
  uchar *hash_start;
  uchar hash [48];
  size_t offset;
  size_t n;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  mbedtls_ssl_context *pmStack_18;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  ciphersuite_info._4_4_ = 0xffff8f80;
  n = (size_t)ssl->transform_negotiate->ciphersuite_info;
  offset = 0;
  hash[0x28] = '\0';
  hash[0x29] = '\0';
  hash[0x2a] = '\0';
  hash[0x2b] = '\0';
  hash[0x2c] = '\0';
  hash[0x2d] = '\0';
  hash[0x2e] = '\0';
  hash[0x2f] = '\0';
  _hashlen = &hash_start;
  pmStack_18 = ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0xb07,"=> write certificate verify");
  ciphersuite_info._4_4_ = mbedtls_ssl_derive_keys(pmStack_18);
  if (ciphersuite_info._4_4_ == 0) {
    if ((((*(int *)(n + 0x18) == 5) || (*(int *)(n + 0x18) == 7)) || (*(int *)(n + 0x18) == 8)) ||
       (*(int *)(n + 0x18) == 6)) {
      mbedtls_debug_print_msg
                (pmStack_18,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xb14,"<= skip write certificate verify");
      pmStack_18->state = pmStack_18->state + 1;
      ssl_local._4_4_ = 0;
    }
    else if ((pmStack_18->client_auth == 0) ||
            (pmVar3 = mbedtls_ssl_own_cert(pmStack_18), pmVar3 == (mbedtls_x509_crt *)0x0)) {
      mbedtls_debug_print_msg
                (pmStack_18,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xb1b,"<= skip write certificate verify");
      pmStack_18->state = pmStack_18->state + 1;
      ssl_local._4_4_ = 0;
    }
    else {
      pmVar4 = mbedtls_ssl_own_key(pmStack_18);
      if (pmVar4 == (mbedtls_pk_context *)0x0) {
        mbedtls_debug_print_msg
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xb22,"got no private key for certificate");
        ssl_local._4_4_ = -0x7600;
      }
      else {
        (*pmStack_18->handshake->calc_verify)(pmStack_18,(uchar *)&hash_start);
        if (pmStack_18->minor_ver == 3) {
          if (pmStack_18->minor_ver != 3) {
            mbedtls_debug_print_msg
                      (pmStack_18,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0xb71,"should never happen");
            return -0x6c00;
          }
          if (pmStack_18->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384) {
            local_74 = MBEDTLS_MD_SHA384;
            pmStack_18->out_msg[4] = '\x05';
          }
          else {
            local_74 = MBEDTLS_MD_SHA256;
            pmStack_18->out_msg[4] = '\x04';
          }
          pmVar4 = mbedtls_ssl_own_key(pmStack_18);
          uVar1 = mbedtls_ssl_sig_from_pk(pmVar4);
          pmStack_18->out_msg[5] = uVar1;
          local_78 = 0;
          hash[0x28] = '\x02';
          hash[0x29] = '\0';
          hash[0x2a] = '\0';
          hash[0x2b] = '\0';
          hash[0x2c] = '\0';
          hash[0x2d] = '\0';
          hash[0x2e] = '\0';
          hash[0x2f] = '\0';
        }
        else {
          local_78 = 0x24;
          local_74 = MBEDTLS_MD_NONE;
          pmVar4 = mbedtls_ssl_own_key(pmStack_18);
          iVar2 = mbedtls_pk_can_do(pmVar4,MBEDTLS_PK_ECDSA);
          if (iVar2 != 0) {
            _hashlen = (uchar **)(hash + 8);
            local_78 = 0x14;
            local_74 = MBEDTLS_MD_SHA1;
          }
        }
        pmVar4 = mbedtls_ssl_own_key(pmStack_18);
        ciphersuite_info._4_4_ =
             mbedtls_pk_sign(pmVar4,local_74,(uchar *)_hashlen,(ulong)local_78,
                             pmStack_18->out_msg + hash._40_8_ + 6,&offset,pmStack_18->conf->f_rng,
                             pmStack_18->conf->p_rng);
        if (ciphersuite_info._4_4_ == 0) {
          pmStack_18->out_msg[hash._40_8_ + 4] = (uchar)(offset >> 8);
          pmStack_18->out_msg[hash._40_8_ + 5] = (uchar)offset;
          pmStack_18->out_msglen = offset + 6 + hash._40_8_;
          pmStack_18->out_msgtype = 0x16;
          *pmStack_18->out_msg = '\x0f';
          pmStack_18->state = pmStack_18->state + 1;
          ciphersuite_info._4_4_ = mbedtls_ssl_write_record(pmStack_18);
          if (ciphersuite_info._4_4_ == 0) {
            mbedtls_debug_print_msg
                      (pmStack_18,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0xb8c,"<= write certificate verify");
            ssl_local._4_4_ = ciphersuite_info._4_4_;
          }
          else {
            mbedtls_debug_print_ret
                      (pmStack_18,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0xb88,"mbedtls_ssl_write_record",ciphersuite_info._4_4_);
            ssl_local._4_4_ = ciphersuite_info._4_4_;
          }
        }
        else {
          mbedtls_debug_print_ret
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0xb79,"mbedtls_pk_sign",ciphersuite_info._4_4_);
          ssl_local._4_4_ = ciphersuite_info._4_4_;
        }
      }
    }
  }
  else {
    mbedtls_debug_print_ret
              (pmStack_18,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xb0b,"mbedtls_ssl_derive_keys",ciphersuite_info._4_4_);
    ssl_local._4_4_ = ciphersuite_info._4_4_;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_certificate_verify( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    size_t n = 0, offset = 0;
    unsigned char hash[48];
    unsigned char *hash_start = hash;
    mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;
    unsigned int hashlen;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write certificate verify" ) );

    if( ( ret = mbedtls_ssl_derive_keys( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_derive_keys", ret );
        return( ret );
    }

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate verify" ) );
        ssl->state++;
        return( 0 );
    }

    if( ssl->client_auth == 0 || mbedtls_ssl_own_cert( ssl ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate verify" ) );
        ssl->state++;
        return( 0 );
    }

    if( mbedtls_ssl_own_key( ssl ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no private key for certificate" ) );
        return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
    }

    /*
     * Make an RSA signature of the handshake digests
     */
    ssl->handshake->calc_verify( ssl, hash );

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /*
         * digitally-signed struct {
         *     opaque md5_hash[16];
         *     opaque sha_hash[20];
         * };
         *
         * md5_hash
         *     MD5(handshake_messages);
         *
         * sha_hash
         *     SHA(handshake_messages);
         */
        hashlen = 36;
        md_alg = MBEDTLS_MD_NONE;

        /*
         * For ECDSA, default hash is SHA-1 only
         */
        if( mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_ECDSA ) )
        {
            hash_start += 16;
            hashlen -= 16;
            md_alg = MBEDTLS_MD_SHA1;
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /*
         * digitally-signed struct {
         *     opaque handshake_messages[handshake_messages_length];
         * };
         *
         * Taking shortcut here. We assume that the server always allows the
         * PRF Hash function and has sent it in the allowed signature
         * algorithms list received in the Certificate Request message.
         *
         * Until we encounter a server that does not, we will take this
         * shortcut.
         *
         * Reason: Otherwise we should have running hashes for SHA512 and SHA224
         *         in order to satisfy 'weird' needs from the server side.
         */
        if( ssl->transform_negotiate->ciphersuite_info->mac ==
            MBEDTLS_MD_SHA384 )
        {
            md_alg = MBEDTLS_MD_SHA384;
            ssl->out_msg[4] = MBEDTLS_SSL_HASH_SHA384;
        }
        else
        {
            md_alg = MBEDTLS_MD_SHA256;
            ssl->out_msg[4] = MBEDTLS_SSL_HASH_SHA256;
        }
        ssl->out_msg[5] = mbedtls_ssl_sig_from_pk( mbedtls_ssl_own_key( ssl ) );

        /* Info from md_alg will be used instead */
        hashlen = 0;
        offset = 2;
    }
    else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    if( ( ret = mbedtls_pk_sign( mbedtls_ssl_own_key( ssl ), md_alg, hash_start, hashlen,
                         ssl->out_msg + 6 + offset, &n,
                         ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_sign", ret );
        return( ret );
    }

    ssl->out_msg[4 + offset] = (unsigned char)( n >> 8 );
    ssl->out_msg[5 + offset] = (unsigned char)( n      );

    ssl->out_msglen  = 6 + n + offset;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CERTIFICATE_VERIFY;

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write certificate verify" ) );

    return( ret );
}